

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_source_read_pcm_frames
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ma_bool32 mVar1;
  ma_result mVar2;
  ma_uint32 mVar3;
  ma_data_source *pDataSource_00;
  ma_uint64 mVar4;
  undefined8 *in_RCX;
  long lVar5;
  ma_uint32 *in_RDX;
  ma_format *in_RSI;
  ma_uint64 *in_RDI;
  ma_uint64 framesRemaining;
  ma_uint64 framesProcessed;
  ma_bool32 loop;
  ma_uint32 emptyLoopCounter;
  ma_uint32 channels;
  ma_format format;
  ma_uint64 totalFramesProcessed;
  void *pRunningFramesOut;
  ma_data_source_base *pCurrentDataSource;
  ma_data_source_base *pDataSourceBase;
  ma_result result;
  ma_format *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff90;
  size_t sVar6;
  uint uVar7;
  int in_stack_ffffffffffffffa0;
  int iVar8;
  ma_format in_stack_ffffffffffffffa4;
  ma_uint32 *pChannels;
  ma_data_source *in_stack_ffffffffffffffb8;
  ma_uint64 *pFramesRead_00;
  uint in_stack_ffffffffffffffc8;
  ma_result local_c;
  
  local_c = MA_SUCCESS;
  pChannels = (ma_uint32 *)0x0;
  uVar7 = 0;
  if (in_RCX != (undefined8 *)0x0) {
    *in_RCX = 0;
  }
  if (in_RDX == (ma_uint32 *)0x0) {
    local_c = MA_INVALID_ARGS;
  }
  else if (in_RDI == (ma_uint64 *)0x0) {
    local_c = MA_INVALID_ARGS;
  }
  else {
    pFramesRead_00 = in_RDI;
    mVar1 = ma_data_source_is_looping(in_RDI);
    mVar2 = ma_data_source_get_data_format
                      (in_stack_ffffffffffffffb8,in_RSI,pChannels,
                       (ma_uint32 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (ma_channel *)CONCAT44(uVar7,mVar1),in_stack_ffffffffffffff90);
    if (mVar2 == MA_SUCCESS) {
      while (pChannels < in_RDX) {
        pDataSource_00 = (ma_data_source *)((long)in_RDX - (long)pChannels);
        local_c = ma_data_source_resolve_current(in_RDI,(ma_data_source **)&stack0xffffffffffffffb8)
        ;
        if ((local_c != MA_SUCCESS) || (in_stack_ffffffffffffffb8 == (ma_data_source *)0x0)) break;
        local_c = ma_data_source_read_pcm_frames_within_range
                            (in_RDX,in_RCX,(ulong)in_stack_ffffffffffffffc8,pFramesRead_00);
        pChannels = (ma_uint32 *)(in_stack_ffffffffffffff90 + (long)pChannels);
        if ((local_c != MA_SUCCESS) && (local_c != MA_AT_END)) break;
        if (local_c == MA_AT_END) {
          local_c = MA_SUCCESS;
          if (mVar1 == 0) {
            if (*(long *)((long)in_stack_ffffffffffffffb8 + 0x30) == 0) {
              if (*(long *)((long)in_stack_ffffffffffffffb8 + 0x38) == 0) break;
              mVar4 = (**(code **)((long)in_stack_ffffffffffffffb8 + 0x38))
                                (in_stack_ffffffffffffffb8);
              pFramesRead_00[5] = mVar4;
              if (pFramesRead_00[5] == 0) break;
            }
            else {
              pFramesRead_00[5] = *(ma_uint64 *)((long)in_stack_ffffffffffffffb8 + 0x30);
            }
            local_c = ma_data_source_seek_to_pcm_frame
                                (pDataSource_00,(ma_uint64)in_stack_ffffffffffffff80);
            if (local_c != MA_SUCCESS) break;
          }
          else {
            if (in_stack_ffffffffffffff90 == 0) {
              uVar7 = uVar7 + 1;
              if (1 < uVar7) break;
            }
            else {
              uVar7 = 0;
            }
            local_c = ma_data_source_seek_to_pcm_frame
                                (pDataSource_00,(ma_uint64)in_stack_ffffffffffffff80);
            if (local_c != MA_SUCCESS) break;
            local_c = MA_SUCCESS;
          }
        }
        if (in_RSI != (ma_format *)0x0) {
          sVar6 = in_stack_ffffffffffffff90;
          iVar8 = in_stack_ffffffffffffffa0;
          mVar3 = ma_get_bytes_per_sample(in_stack_ffffffffffffffa4);
          lVar5 = in_stack_ffffffffffffff90 * (mVar3 * in_stack_ffffffffffffffa0);
          in_stack_ffffffffffffff80 = in_RSI;
          in_stack_ffffffffffffff90 = sVar6;
          in_stack_ffffffffffffffa0 = iVar8;
          in_RSI = (ma_format *)((long)in_RSI + lVar5);
        }
      }
      if (in_RCX != (undefined8 *)0x0) {
        *in_RCX = pChannels;
      }
      if ((local_c == MA_SUCCESS) && (pChannels == (ma_uint32 *)0x0)) {
        local_c = MA_AT_END;
      }
    }
    else {
      local_c = ma_data_source_resolve_current(in_RDI,(ma_data_source **)&stack0xffffffffffffffb8);
      if (local_c == MA_SUCCESS) {
        local_c = ma_data_source_read_pcm_frames_within_range
                            (in_RDX,in_RCX,(ulong)in_stack_ffffffffffffffc8,pFramesRead_00);
      }
    }
  }
  return local_c;
}

Assistant:

MA_API ma_result ma_data_source_read_pcm_frames(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;
    ma_data_source_base* pCurrentDataSource;
    void* pRunningFramesOut = pFramesOut;
    ma_uint64 totalFramesProcessed = 0;
    ma_format format;
    ma_uint32 channels;
    ma_uint32 emptyLoopCounter = 0; /* Keeps track of how many times 0 frames have been read. For infinite loop detection of sounds with no audio data. */
    ma_bool32 loop;

    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pDataSourceBase == NULL) {
        return MA_INVALID_ARGS;
    }

    loop = ma_data_source_is_looping(pDataSource);

    /*
    We need to know the data format so we can advance the output buffer as we read frames. If this
    fails, chaining will not work and we'll just read as much as we can from the current source.
    */
    if (ma_data_source_get_data_format(pDataSource, &format, &channels, NULL, NULL, 0) != MA_SUCCESS) {
        result = ma_data_source_resolve_current(pDataSource, (ma_data_source**)&pCurrentDataSource);
        if (result != MA_SUCCESS) {
            return result;
        }

        return ma_data_source_read_pcm_frames_within_range(pCurrentDataSource, pFramesOut, frameCount, pFramesRead);
    }

    /*
    Looping is a bit of a special case. When the `loop` argument is true, chaining will not work and
    only the current data source will be read from.
    */

    /* Keep reading until we've read as many frames as possible. */
    while (totalFramesProcessed < frameCount) {
        ma_uint64 framesProcessed;
        ma_uint64 framesRemaining = frameCount - totalFramesProcessed;

        /* We need to resolve the data source that we'll actually be reading from. */
        result = ma_data_source_resolve_current(pDataSource, (ma_data_source**)&pCurrentDataSource);
        if (result != MA_SUCCESS) {
            break;
        }

        if (pCurrentDataSource == NULL) {
            break;
        }

        result = ma_data_source_read_pcm_frames_within_range(pCurrentDataSource, pRunningFramesOut, framesRemaining, &framesProcessed);
        totalFramesProcessed += framesProcessed;

        /*
        If we encountered an error from the read callback, make sure it's propagated to the caller. The caller may need to know whether or not MA_BUSY is returned which is
        not necessarily considered an error.
        */
        if (result != MA_SUCCESS && result != MA_AT_END) {
            break;
        }

        /*
        We can determine if we've reached the end by checking if ma_data_source_read_pcm_frames_within_range() returned
        MA_AT_END. To loop back to the start, all we need to do is seek back to the first frame.
        */
        if (result == MA_AT_END) {
            /*
            The result needs to be reset back to MA_SUCCESS (from MA_AT_END) so that we don't
            accidentally return MA_AT_END when data has been read in prior loop iterations. at the
            end of this function, the result will be checked for MA_SUCCESS, and if the total
            number of frames processed is 0, will be explicitly set to MA_AT_END.
            */
            result = MA_SUCCESS;

            /*
            We reached the end. If we're looping, we just loop back to the start of the current
            data source. If we're not looping we need to check if we have another in the chain, and
            if so, switch to it.
            */
            if (loop) {
                if (framesProcessed == 0) {
                    emptyLoopCounter += 1;
                    if (emptyLoopCounter > 1) {
                        break;  /* Infinite loop detected. Get out. */
                    }
                } else {
                    emptyLoopCounter = 0;
                }

                result = ma_data_source_seek_to_pcm_frame(pCurrentDataSource, pCurrentDataSource->loopBegInFrames);
                if (result != MA_SUCCESS) {
                    break;  /* Failed to loop. Abort. */
                }

                /* Don't return MA_AT_END for looping sounds. */
                result = MA_SUCCESS;
            } else {
                if (pCurrentDataSource->pNext != NULL) {
                    pDataSourceBase->pCurrent = pCurrentDataSource->pNext;
                } else if (pCurrentDataSource->onGetNext != NULL) {
                    pDataSourceBase->pCurrent = pCurrentDataSource->onGetNext(pCurrentDataSource);
                    if (pDataSourceBase->pCurrent == NULL) {
                        break;  /* Our callback did not return a next data source. We're done. */
                    }
                } else {
                    /* Reached the end of the chain. We're done. */
                    break;
                }

                /* The next data source needs to be rewound to ensure data is read in looping scenarios. */
                result = ma_data_source_seek_to_pcm_frame(pDataSourceBase->pCurrent, 0);
                if (result != MA_SUCCESS) {
                    break;
                }
            }
        }

        if (pRunningFramesOut != NULL) {
            pRunningFramesOut = ma_offset_ptr(pRunningFramesOut, framesProcessed * ma_get_bytes_per_frame(format, channels));
        }
    }

    if (pFramesRead != NULL) {
        *pFramesRead = totalFramesProcessed;
    }

    MA_ASSERT(!(result == MA_AT_END && totalFramesProcessed > 0));  /* We should never be returning MA_AT_END if we read some data. */

    if (result == MA_SUCCESS && totalFramesProcessed == 0) {
        result  = MA_AT_END;
    }

    return result;
}